

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackedArrayType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
          (BumpAllocator *this,Type *args,ConstantRange *args_1,uint *args_2)

{
  PackedArrayType *pPVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  undefined8 in_RDI;
  bitwidth_t fullWidth;
  Type *unaff_retaddr;
  PackedArrayType *in_stack_00000008;
  ConstantRange in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  fullWidth = (bitwidth_t)((ulong)in_RDI >> 0x20);
  pPVar1 = (PackedArrayType *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  ast::PackedArrayType::PackedArrayType(in_stack_00000008,unaff_retaddr,in_stack_00000010,fullWidth)
  ;
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }